

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O0

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::update_cohomology_groups
          (Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Simplex_handle sigma,int dim_sigma)

{
  Arith_element AVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Element EVar5;
  reference ppVar6;
  pointer ppVar7;
  tuple<int&,int&> local_f0 [16];
  pair<int,_int> local_e0;
  undefined1 local_d8 [16];
  reverse_iterator a_ds_rit;
  int local_c0;
  Arith_element prod;
  Arith_element charac;
  Arith_element inv_x;
  unsigned_long uStack_a8;
  pair<const_unsigned_long,_int> map_a_ds_ref;
  _Self local_90;
  iterator __end0;
  iterator __begin0;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  *__range4;
  A_ds_type a_ds;
  undefined1 local_50 [8];
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  map_a_ds;
  int dim_sigma_local;
  Simplex_handle sigma_local;
  Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
  *this_local;
  
  map_a_ds._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = dim_sigma;
  std::
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  ::map((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
         *)local_50);
  annotation_of_the_boundary
            (this,(map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                   *)local_50,sigma,map_a_ds._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_)
  ;
  bVar2 = std::
          map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
          ::empty((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                   *)local_50);
  if (bVar2) {
    if (map_a_ds._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < this->dim_max_) {
      EVar5 = Field_Zp::multiplicative_identity(&this->coeff_field_,0);
      iVar4 = Field_Zp::characteristic(&this->coeff_field_);
      create_cocycle(this,sigma,EVar5,iVar4);
    }
  }
  else {
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    vector((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *
           )&__range4);
    __end0 = std::
             map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
             ::begin((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                      *)local_50);
    local_90._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
         ::end((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                *)local_50);
    while (bVar2 = std::operator!=(&__end0,&local_90), bVar2) {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_>::operator*(&__end0);
      uStack_a8 = ppVar6->first;
      map_a_ds_ref.first = *(unsigned_long *)&ppVar6->second;
      std::pair<unsigned_long,_int>::pair<int_&,_true>
                ((pair<unsigned_long,_int> *)&charac,&uStack_a8,(int *)&map_a_ds_ref);
      std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
      push_back((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                 *)&__range4,(value_type *)&charac);
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_>::operator++(&__end0);
    }
    a_ds_rit.current._M_current._4_4_ = Field_Zp::characteristic(&this->coeff_field_);
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    rbegin((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *
           )(local_d8 + 8));
    while( true ) {
      std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
      rend((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *
           )local_d8);
      bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>_>
                               *)(local_d8 + 8),
                              (reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>_>
                               *)local_d8);
      iVar4 = a_ds_rit.current._M_current._4_4_;
      bVar2 = false;
      if (bVar3) {
        EVar5 = Field_Zp::multiplicative_identity(&this->coeff_field_,0);
        bVar2 = iVar4 != EVar5;
      }
      iVar4 = a_ds_rit.current._M_current._4_4_;
      if (!bVar2) break;
      ppVar7 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>_>
                             *)(local_d8 + 8));
      local_e0 = Field_Zp::inverse(&this->coeff_field_,ppVar7->second,
                                   a_ds_rit.current._M_current._4_4_);
      std::tie<int,int>((int *)local_f0,&prod);
      std::tuple<int&,int&>::operator=(local_f0,&local_e0);
      AVar1 = prod;
      EVar5 = Field_Zp::additive_identity(&this->coeff_field_);
      if (AVar1 != EVar5) {
        ppVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>_>
                               *)(local_d8 + 8));
        destroy_cocycle(this,sigma,(A_ds_type *)&__range4,ppVar7->first,prod,local_c0);
        a_ds_rit.current._M_current._4_4_ = a_ds_rit.current._M_current._4_4_ / local_c0;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>_>
                    *)(local_d8 + 8));
    }
    EVar5 = Field_Zp::multiplicative_identity(&this->coeff_field_,0);
    if ((iVar4 != EVar5) &&
       (map_a_ds._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < this->dim_max_)) {
      EVar5 = Field_Zp::multiplicative_identity
                        (&this->coeff_field_,a_ds_rit.current._M_current._4_4_);
      create_cocycle(this,sigma,EVar5,a_ds_rit.current._M_current._4_4_);
    }
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    ~vector((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
             *)&__range4);
  }
  std::
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  ::~map((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
          *)local_50);
  return;
}

Assistant:

void update_cohomology_groups(Simplex_handle sigma, int dim_sigma) {
// Compute the annotation of the boundary of sigma:
    std::map<Simplex_key, Arith_element> map_a_ds;
    annotation_of_the_boundary(map_a_ds, sigma, dim_sigma);
// Update the cohomology groups:
    if (map_a_ds.empty()) {  // sigma is a creator in all fields represented in coeff_field_
      if (dim_sigma < dim_max_) {
        create_cocycle(sigma, coeff_field_.multiplicative_identity(),
                       coeff_field_.characteristic());
      }
    } else {        // sigma is a destructor in at least a field in coeff_field_
      // Convert map_a_ds to a vector
      A_ds_type a_ds;  // admits reverse iterators
      for (auto map_a_ds_ref : map_a_ds) {
        a_ds.push_back(
            std::pair<Simplex_key, Arith_element>(map_a_ds_ref.first,
                                                  map_a_ds_ref.second));
      }

      Arith_element inv_x, charac;
      Arith_element prod = coeff_field_.characteristic();  // Product of characteristic of the fields
      for (auto a_ds_rit = a_ds.rbegin();
          (a_ds_rit != a_ds.rend())
              && (prod != coeff_field_.multiplicative_identity()); ++a_ds_rit) {
        std::tie(inv_x, charac) = coeff_field_.inverse(a_ds_rit->second, prod);

        if (inv_x != coeff_field_.additive_identity()) {
          destroy_cocycle(sigma, a_ds, a_ds_rit->first, inv_x, charac);
          prod /= charac;
        }
      }
      if (prod != coeff_field_.multiplicative_identity()
          && dim_sigma < dim_max_) {
        create_cocycle(sigma, coeff_field_.multiplicative_identity(prod), prod);
      }
    }
  }